

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edk2_vss.cpp
# Opt level: O2

bool __thiscall edk2_vss_t::vss_variable_t::is_auth(vss_variable_t *this)

{
  vss_variable_attributes_t *pvVar1;
  bool bVar2;
  
  if (this->f_is_auth == true) {
    return this->m_is_auth;
  }
  if ((this->m_state | 4) == 0xfc) {
    bVar2 = false;
  }
  else {
    pvVar1 = (this->m_attributes)._M_t.
             super___uniq_ptr_impl<edk2_vss_t::vss_variable_attributes_t,_std::default_delete<edk2_vss_t::vss_variable_attributes_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_edk2_vss_t::vss_variable_attributes_t_*,_std::default_delete<edk2_vss_t::vss_variable_attributes_t>_>
             .super__Head_base<0UL,_edk2_vss_t::vss_variable_attributes_t_*,_false>._M_head_impl;
    bVar2 = true;
    if ((((pvVar1->m_auth_write == false) && (pvVar1->m_time_based_auth == false)) &&
        (pvVar1->m_append_write == false)) && (this->m_len_name != 0)) {
      bVar2 = this->m_len_data == 0;
    }
  }
  this->m_is_auth = bVar2;
  this->f_is_auth = true;
  return bVar2;
}

Assistant:

bool edk2_vss_t::vss_variable_t::is_auth() {
    if (f_is_auth)
        return m_is_auth;
    m_is_auth =  ((state() != 248) && (state() != 252) && ( (( ((attributes()->auth_write()) || (attributes()->time_based_auth()) || (attributes()->append_write())) ) || ( ((len_name() == 0) || (len_data() == 0)) )) )) ;
    f_is_auth = true;
    return m_is_auth;
}